

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

int Gia_ManHashAndTry(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int *piVar2;
  undefined4 local_30;
  undefined4 local_2c;
  int *pPlace;
  int iLit1_local;
  int iLit0_local;
  Gia_Man_t *p_local;
  
  if (iLit0 < 2) {
    local_2c = iLit1;
    if (iLit0 == 0) {
      local_2c = 0;
    }
    p_local._4_4_ = local_2c;
  }
  else if (iLit1 < 2) {
    local_30 = iLit0;
    if (iLit1 == 0) {
      local_30 = 0;
    }
    p_local._4_4_ = local_30;
  }
  else {
    p_local._4_4_ = iLit1;
    if (iLit0 != iLit1) {
      iVar1 = Abc_LitNot(iLit1);
      if (iLit0 == iVar1) {
        p_local._4_4_ = 0;
      }
      else {
        pPlace._0_4_ = iLit1;
        pPlace._4_4_ = iLit0;
        if (iLit1 < iLit0) {
          pPlace._0_4_ = iLit0;
          pPlace._4_4_ = iLit1;
        }
        piVar2 = Gia_ManHashFind(p,pPlace._4_4_,(int)pPlace,-1);
        if (*piVar2 == 0) {
          p_local._4_4_ = -1;
        }
        else {
          p_local._4_4_ = Abc_Var2Lit(*piVar2,0);
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManHashAndTry( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    if ( iLit0 < 2 )
        return iLit0 ? iLit1 : 0;
    if ( iLit1 < 2 )
        return iLit1 ? iLit0 : 0;
    if ( iLit0 == iLit1 )
        return iLit1;
    if ( iLit0 == Abc_LitNot(iLit1) )
        return 0;
    if ( iLit0 > iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1;
    {
        int * pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
        if ( *pPlace ) 
            return Abc_Var2Lit( *pPlace, 0 );
        return -1;
    }
}